

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

void fsg_model_write_fsm_trans(fsg_model_t *fsg,int i,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar3;
  char *pcVar4;
  float64 fVar5;
  
  for (itor = fsg_model_arcs(fsg,i); itor != (fsg_arciter_t *)0x0; itor = fsg_arciter_next(itor)) {
    pfVar3 = fsg_arciter_get(itor);
    pcVar4 = "<eps>";
    if (-1 < (long)pfVar3->wid) {
      pcVar4 = fsg->vocab[pfVar3->wid];
    }
    uVar1 = pfVar3->from_state;
    uVar2 = pfVar3->to_state;
    fVar5 = logmath_log_to_ln(fsg->lmath,(int)((float)pfVar3->logs2prob / (float)fsg->lw));
    fprintf((FILE *)fp,"%d %d %s %f\n",-(double)fVar5,(ulong)uVar1,(ulong)uVar2,pcVar4);
  }
  return;
}

Assistant:

static void
fsg_model_write_fsm_trans(fsg_model_t * fsg, int i, FILE * fp)
{
    fsg_arciter_t *itor;

    for (itor = fsg_model_arcs(fsg, i); itor;
         itor = fsg_arciter_next(itor)) {
        fsg_link_t *tl = fsg_arciter_get(itor);
        fprintf(fp, "%d %d %s %f\n",
                tl->from_state, tl->to_state,
                (tl->wid < 0) ? "<eps>" : fsg_model_word_str(fsg, tl->wid),
                -logmath_log_to_ln(fsg->lmath, tl->logs2prob / fsg->lw));
    }
}